

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O0

Status __thiscall osqp::OsqpSolver::UpdateMaxIter(OsqpSolver *this,int max_iter_new)

{
  bool bVar1;
  c_int cVar2;
  AlphaNum *in_RCX;
  int in_EDX;
  undefined4 in_register_00000034;
  unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *this_00;
  string_view message;
  string_view message_00;
  string_view message_01;
  OSQPWorkspace *in_stack_fffffffffffffee8;
  basic_string_view<char,_std::char_traits<char>_> local_e0 [2];
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  undefined1 local_40 [16];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  int local_1c;
  unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *puStack_18;
  int max_iter_new_local;
  OsqpSolver *this_local;
  
  this_00 = (unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)
            CONCAT44(in_register_00000034,max_iter_new);
  local_1c = in_EDX;
  puStack_18 = this_00;
  this_local = this;
  bVar1 = IsInitialized((OsqpSolver *)this_00);
  if (bVar1) {
    if (local_1c < 1) {
      absl::AlphaNum::AlphaNum(&local_90,"Invalid max_iter value: ");
      absl::AlphaNum::AlphaNum(&local_c0,local_1c);
      absl::StrCat_abi_cxx11_(&local_60,(absl *)&local_90,&local_c0,in_RCX);
      local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
      message_00._M_str = local_40._0_8_;
      message_00._M_len = (size_t)this;
      absl::InvalidArgumentError(message_00);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::get(this_00);
      cVar2 = osqp_update_max_iter(in_stack_fffffffffffffee8,0x1ba6d6);
      if (cVar2 == 0) {
        absl::OkStatus();
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (local_e0,"osqp_update_max_iter unexpectedly failed.");
        message_01._M_str = (char *)local_e0[0]._M_len;
        message_01._M_len = (size_t)this;
        absl::UnknownError(message_01);
      }
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"OsqpSolver is not initialized.");
    message._M_str = (char *)local_30._M_len;
    message._M_len = (size_t)this;
    absl::FailedPreconditionError(message);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdateMaxIter(const int max_iter_new) {
  if (!IsInitialized()) {
    return absl::FailedPreconditionError("OsqpSolver is not initialized.");
  }
  if (max_iter_new <= 0) {
    return absl::InvalidArgumentError(
        absl::StrCat("Invalid max_iter value: ", max_iter_new));
  }
  if (osqp_update_max_iter(workspace_.get(), max_iter_new) != 0) {
    return absl::UnknownError("osqp_update_max_iter unexpectedly failed.");
  }
  return absl::OkStatus();
}